

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall
Js::FunctionBody::CanInlineRecursively(FunctionBody *this,uint depth,bool tryAggressive)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar8 [16];
  
  uVar3 = GetNumberOfRecursiveCallSites(this);
  uVar6 = DAT_0143eefc;
  uVar2 = DAT_0143eef8;
  uVar1 = DAT_0143eef4;
  if (uVar3 == this->profiledCallSiteCount && tryAggressive) {
    uVar4 = GetByteCodeWithoutLDACount(this);
    uVar5 = (uint)((ulong)uVar1 / (ulong)uVar4);
    if (uVar3 != 1) {
      dVar7 = log((double)(int)uVar3);
      auVar8._0_8_ = log((double)((ulong)uVar1 / (ulong)uVar4) / dVar7);
      auVar8._8_8_ = extraout_XMM0_Qb;
      auVar8 = roundsd(auVar8,auVar8,10);
      uVar5 = (uint)(long)auVar8._0_8_;
    }
    if (uVar6 < uVar5) {
      uVar6 = uVar5;
    }
    if (uVar2 <= uVar6) {
      uVar6 = uVar2;
    }
  }
  return depth < uVar6;
}

Assistant:

bool FunctionBody::CanInlineRecursively(uint depth, bool tryAggressive)
    {
        uint recursiveInlineSpan = this->GetNumberOfRecursiveCallSites();

        uint minRecursiveInlineDepth = (uint)CONFIG_FLAG(RecursiveInlineDepthMin);

        if (recursiveInlineSpan != this->GetProfiledCallSiteCount() || tryAggressive == false)
        {
            return depth < minRecursiveInlineDepth;
        }

        uint maxRecursiveInlineDepth = (uint)CONFIG_FLAG(RecursiveInlineDepthMax);
        uint maxRecursiveBytecodeBudget = (uint)CONFIG_FLAG(RecursiveInlineThreshold);
        uint numberOfAllowedFuncs = maxRecursiveBytecodeBudget / this->GetByteCodeWithoutLDACount();
        uint maxDepth;

        if (recursiveInlineSpan == 1)
        {
            maxDepth = numberOfAllowedFuncs;
        }
        else
        {
            maxDepth = (uint)ceil(log((double)((double)numberOfAllowedFuncs) / log((double)recursiveInlineSpan)));
        }
        maxDepth = maxDepth < minRecursiveInlineDepth ? minRecursiveInlineDepth : maxDepth;
        maxDepth = maxDepth < maxRecursiveInlineDepth ? maxDepth : maxRecursiveInlineDepth;
        return depth < maxDepth;
    }